

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiccr<(moira::Instr)11,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  u16 uVar6;
  byte bVar7;
  u32 uVar8;
  
  uVar6 = (this->queue).irc;
  readExt(this);
  bVar1 = (this->reg).sr.c;
  bVar2 = (this->reg).sr.v;
  bVar3 = (this->reg).sr.z;
  bVar4 = (this->reg).sr.n;
  bVar5 = (this->reg).sr.x;
  (*this->_vptr_Moira[0x19])(this,8);
  bVar7 = (bVar5 << 4 | bVar1 + bVar2 * '\x02' + bVar3 * '\x04' + bVar4 * '\b') & (byte)uVar6;
  (this->reg).sr.c = (bool)(bVar7 & 1);
  (this->reg).sr.v = (bool)(bVar7 >> 1 & 1);
  (this->reg).sr.z = (bool)(bVar7 >> 2 & 1);
  (this->reg).sr.n = (bool)(bVar7 >> 3 & 1);
  (this->reg).sr.x = (bool)(bVar7 >> 4 & 1);
  readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
  uVar8 = (this->reg).pc;
  (this->reg).pc0 = uVar8;
  (this->queue).ird = (this->queue).irc;
  uVar8 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar8 + 2);
  (this->queue).irc = (u16)uVar8;
  return;
}

Assistant:

void
Moira::execAndiccr(u16 opcode)
{
    u32 src = readI<S>();
    u8  dst = getCCR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setCCR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}